

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O1

int cPow(int x,int n)

{
  int iVar1;
  
  iVar1 = 1;
  if (0 < n) {
    do {
      iVar1 = iVar1 * x;
      n = n + -1;
    } while (n != 0);
  }
  return iVar1;
}

Assistant:

procedure 
int cPow(int x, int n) {
	variable int i; variable int r;
	r = 1; i = 0;
	while (i < n) {
		r = r * x;
		i = i + 1;
	}
	return r;
}